

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_3::writeVariableReadAccumulateExpression
               (ostringstream *buf,string *accumulatorName,string *name,ShaderType shaderType,
               Storage storage,Program *program,VarType *varType)

{
  Type TVar1;
  DataType DVar2;
  pointer pcVar3;
  deUint32 dVar4;
  long *plVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  ulong uVar8;
  size_type *psVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string local_238;
  string *local_218;
  long *local_210;
  undefined8 local_208;
  long local_200;
  undefined8 uStack_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  ostringstream *local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  TVar1 = varType->m_type;
  local_218 = accumulatorName;
  if (TVar1 != TYPE_BASIC) {
    if (TVar1 == TYPE_ARRAY) {
      iVar10 = (varType->m_data).array.size;
      if (iVar10 == -1) {
        if (storage == STORAGE_BUFFER) {
          pcVar3 = (name->_M_dataplus)._M_p;
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar3,pcVar3 + name->_M_string_length);
          std::__cxx11::string::append((char *)local_1a8);
          writeVariableReadAccumulateExpression
                    (buf,local_218,local_1a8,shaderType,STORAGE_BUFFER,program,
                     (varType->m_data).array.elementType);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p == &local_1a8[0].field_2) {
            return;
          }
        }
        else {
          if (shaderType == SHADERTYPE_GEOMETRY) {
            std::operator+(local_1a8,name,"[0]");
            writeVariableReadAccumulateExpression
                      (buf,local_218,local_1a8,SHADERTYPE_GEOMETRY,storage,program,
                       (varType->m_data).array.elementType);
          }
          else {
            if (shaderType != SHADERTYPE_TESSELLATION_CONTROL) {
              if (shaderType != SHADERTYPE_TESSELLATION_EVALUATION) {
                return;
              }
              local_1b0 = buf;
              dVar4 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices
                                (program);
              if ((int)dVar4 < 1) {
                return;
              }
              iVar10 = 0;
              do {
                pcVar3 = (name->_M_dataplus)._M_p;
                local_1f0 = local_1e0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1f0,pcVar3,pcVar3 + name->_M_string_length);
                std::__cxx11::string::append((char *)&local_1f0);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::ostream::operator<<(local_1a8,iVar10);
                std::__cxx11::stringbuf::str();
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
                uVar8 = 0xf;
                if (local_1f0 != local_1e0) {
                  uVar8 = local_1e0[0];
                }
                if (uVar8 < (ulong)(local_1c8 + local_1e8)) {
                  uVar8 = 0xf;
                  if (local_1d0 != local_1c0) {
                    uVar8 = local_1c0[0];
                  }
                  if (uVar8 < (ulong)(local_1c8 + local_1e8)) goto LAB_0066e406;
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_1f0);
                }
                else {
LAB_0066e406:
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_1d0);
                }
                plVar5 = puVar6 + 2;
                if ((long *)*puVar6 == plVar5) {
                  local_200 = *plVar5;
                  uStack_1f8 = puVar6[3];
                  local_210 = &local_200;
                }
                else {
                  local_200 = *plVar5;
                  local_210 = (long *)*puVar6;
                }
                local_208 = puVar6[1];
                *puVar6 = plVar5;
                puVar6[1] = 0;
                *(undefined1 *)plVar5 = 0;
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_210);
                psVar9 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar9) {
                  local_238.field_2._M_allocated_capacity = *psVar9;
                  local_238.field_2._8_8_ = plVar5[3];
                  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                }
                else {
                  local_238.field_2._M_allocated_capacity = *psVar9;
                  local_238._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_238._M_string_length = plVar5[1];
                *plVar5 = (long)psVar9;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                writeVariableReadAccumulateExpression
                          (local_1b0,local_218,&local_238,SHADERTYPE_TESSELLATION_EVALUATION,storage
                           ,program,(varType->m_data).array.elementType);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != &local_238.field_2) {
                  operator_delete(local_238._M_dataplus._M_p,
                                  local_238.field_2._M_allocated_capacity + 1);
                }
                if (local_210 != &local_200) {
                  operator_delete(local_210,local_200 + 1);
                }
                if (local_1d0 != local_1c0) {
                  operator_delete(local_1d0,local_1c0[0] + 1);
                }
                if (local_1f0 != local_1e0) {
                  operator_delete(local_1f0,local_1e0[0] + 1);
                }
                iVar10 = iVar10 + 1;
                dVar4 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices
                                  (program);
                if ((int)dVar4 <= iVar10) {
                  return;
                }
              } while( true );
            }
            std::operator+(local_1a8,name,"[gl_InvocationID]");
            writeVariableReadAccumulateExpression
                      (buf,local_218,local_1a8,SHADERTYPE_TESSELLATION_CONTROL,storage,program,
                       (varType->m_data).array.elementType);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p == &local_1a8[0].field_2) {
            return;
          }
        }
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      else if (0 < iVar10) {
        iVar10 = 0;
        do {
          pcVar3 = (name->_M_dataplus)._M_p;
          local_1f0 = local_1e0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f0,pcVar3,pcVar3 + name->_M_string_length);
          std::__cxx11::string::append((char *)&local_1f0);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::operator<<(local_1a8,iVar10);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar8 = 0xf;
          if (local_1f0 != local_1e0) {
            uVar8 = local_1e0[0];
          }
          if (uVar8 < (ulong)(local_1c8 + local_1e8)) {
            uVar8 = 0xf;
            if (local_1d0 != local_1c0) {
              uVar8 = local_1c0[0];
            }
            if (uVar8 < (ulong)(local_1c8 + local_1e8)) goto LAB_0066dfd9;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_1f0)
            ;
          }
          else {
LAB_0066dfd9:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_1d0);
          }
          local_210 = &local_200;
          plVar5 = puVar6 + 2;
          if ((long *)*puVar6 == plVar5) {
            local_200 = *plVar5;
            uStack_1f8 = puVar6[3];
          }
          else {
            local_200 = *plVar5;
            local_210 = (long *)*puVar6;
          }
          local_208 = puVar6[1];
          *puVar6 = plVar5;
          puVar6[1] = 0;
          *(undefined1 *)plVar5 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_210);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_238.field_2._M_allocated_capacity = *psVar9;
            local_238.field_2._8_8_ = plVar5[3];
          }
          else {
            local_238.field_2._M_allocated_capacity = *psVar9;
            local_238._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_238._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          writeVariableReadAccumulateExpression
                    (buf,local_218,&local_238,shaderType,storage,program,
                     (varType->m_data).array.elementType);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if (local_210 != &local_200) {
            operator_delete(local_210,local_200 + 1);
          }
          if (local_1d0 != local_1c0) {
            operator_delete(local_1d0,local_1c0[0] + 1);
          }
          if (local_1f0 != local_1e0) {
            operator_delete(local_1f0,local_1e0[0] + 1);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < (varType->m_data).array.size);
      }
    }
    else if ((TVar1 == TYPE_STRUCT) &&
            (0 < (int)((ulong)((long)(((varType->m_data).structPtr)->m_members).
                                     super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(((varType->m_data).structPtr)->m_members).
                                    super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249))
    {
      lVar12 = 0x20;
      lVar13 = 0;
      do {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        pcVar3 = (name->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,pcVar3,pcVar3 + name->_M_string_length);
        std::__cxx11::string::append((char *)&local_238);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1a8[0].field_2._0_8_ = *psVar9;
          local_1a8[0].field_2._8_8_ = plVar5[3];
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar9;
          local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1a8[0]._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        writeVariableReadAccumulateExpression
                  (buf,local_218,local_1a8,shaderType,storage,program,
                   (VarType *)
                   ((long)&(((((varType->m_data).structPtr)->m_members).
                             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_name)._M_dataplus._M_p +
                   lVar12));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0x38;
      } while (lVar13 < (int)((ulong)((long)(((varType->m_data).structPtr)->m_members).
                                            super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(((varType->m_data).structPtr)->m_members).
                                           super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x49249249);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)buf,"\t",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)buf,(local_218->_M_dataplus)._M_p,local_218->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," += ",4);
  DVar2 = (varType->m_data).basic.type;
  uVar8 = (ulong)DVar2;
  if (uVar8 < 0x24) {
    if ((0x77003801cU >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0066e1ad;
    if ((0x888004002U >> (uVar8 & 0x3f) & 1) == 0) goto LAB_0066e574;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)buf,"vec4(float(",0xb);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)buf,(name->_M_dataplus)._M_p,name->_M_string_length);
    pcVar11 = "))";
    lVar12 = 2;
  }
  else {
LAB_0066e574:
    if (DVar2 - TYPE_BOOL_VEC2 < 3) {
LAB_0066e1ad:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)buf,"vec4(",5);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)buf,(name->_M_dataplus)._M_p,name->_M_string_length);
      pcVar11 = ".xyxy)";
      lVar12 = 6;
    }
    else if (DVar2 - TYPE_FLOAT_MAT2 < 9 || DVar2 - TYPE_DOUBLE_MAT2 < 9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)buf,"vec4(float(",0xb);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)buf,(name->_M_dataplus)._M_p,name->_M_string_length);
      pcVar11 = "[0][0]))";
LAB_0066e5c9:
      lVar12 = 8;
    }
    else {
      if (DVar2 - TYPE_SAMPLER_2D_MULTISAMPLE < 3) {
        pcVar11 = "vec4(float(textureSize(";
        lVar12 = 0x17;
      }
      else {
        if (DVar2 - TYPE_SAMPLER_1D < 0x1e) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)buf,"vec4(float(textureSize(",0x17);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)buf,(name->_M_dataplus)._M_p,name->_M_string_length);
          pcVar11 = ", 0).x))";
          goto LAB_0066e5c9;
        }
        if (0xd < DVar2 - TYPE_IMAGE_2D) {
          if (DVar2 != TYPE_UINT_ATOMIC_COUNTER) goto LAB_0066e2c1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)buf,"vec4(float(atomicCounterIncrement(",0x22);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)buf,(name->_M_dataplus)._M_p,name->_M_string_length);
          pcVar11 = ")))";
          lVar12 = 3;
          goto LAB_0066e2b9;
        }
        pcVar11 = "vec4(float(imageSize(";
        lVar12 = 0x15;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)buf,pcVar11,lVar12);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)buf,(name->_M_dataplus)._M_p,name->_M_string_length);
      pcVar11 = ").x))";
      lVar12 = 5;
    }
  }
LAB_0066e2b9:
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar11,lVar12);
LAB_0066e2c1:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)buf,";\n",2);
  return;
}

Assistant:

static void writeVariableReadAccumulateExpression (std::ostringstream&							buf,
												   const std::string&							accumulatorName,
												   const std::string&							name,
												   glu::ShaderType								shaderType,
												   glu::Storage									storage,
												   const ProgramInterfaceDefinition::Program*	program,
												   const glu::VarType&							varType)
{
	if (varType.isBasicType())
	{
		buf << "\t" << accumulatorName << " += ";

		if (glu::isDataTypeScalar(varType.getBasicType()))
			buf << "vec4(float(" << name << "))";
		else if (glu::isDataTypeVector(varType.getBasicType()))
			buf << "vec4(" << name << ".xyxy)";
		else if (glu::isDataTypeMatrix(varType.getBasicType()))
			buf << "vec4(float(" << name << "[0][0]))";
		else if (glu::isDataTypeSamplerMultisample(varType.getBasicType()))
			buf << "vec4(float(textureSize(" << name << ").x))";
		else if (glu::isDataTypeSampler(varType.getBasicType()))
			buf << "vec4(float(textureSize(" << name << ", 0).x))";
		else if (glu::isDataTypeImage(varType.getBasicType()))
			buf << "vec4(float(imageSize(" << name << ").x))";
		else if (varType.getBasicType() == glu::TYPE_UINT_ATOMIC_COUNTER)
			buf << "vec4(float(atomicCounterIncrement(" << name << ")))";
		else
			DE_ASSERT(false);

		buf << ";\n";
	}
	else if (varType.isStructType())
	{
		for (int ndx = 0; ndx < varType.getStructPtr()->getNumMembers(); ++ndx)
			writeVariableReadAccumulateExpression(buf,
												  accumulatorName,
												  name + "." + varType.getStructPtr()->getMember(ndx).getName(),
												  shaderType,
												  storage,
												  program,
												  varType.getStructPtr()->getMember(ndx).getType());
	}
	else if (varType.isArrayType())
	{
		if (varType.getArraySize() != glu::VarType::UNSIZED_ARRAY)
		{
			for (int ndx = 0; ndx < varType.getArraySize(); ++ndx)
				writeVariableReadAccumulateExpression(buf,
													  accumulatorName,
													  name + "[" + de::toString(ndx) + "]",
													  shaderType,
													  storage,
													  program,
													  varType.getElementType());
		}
		else if (storage == glu::STORAGE_BUFFER)
		{
			// run-time sized array, read arbitrary
			writeVariableReadAccumulateExpression(buf,
												  accumulatorName,
												  name + "[8]",
												  shaderType,
												  storage,
												  program,
												  varType.getElementType());
		}
		else
		{
			DE_ASSERT(storage == glu::STORAGE_IN);

			if (shaderType == glu::SHADERTYPE_GEOMETRY)
			{
				// implicit sized geometry input array, size = primitive size. Just reading first is enough
				writeVariableReadAccumulateExpression(buf,
													  accumulatorName,
													  name + "[0]",
													  shaderType,
													  storage,
													  program,
													  varType.getElementType());
			}
			else if (shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)
			{
				// implicit sized tessellation input array, size = input patch max size. Just reading current is enough
				writeVariableReadAccumulateExpression(buf,
													  accumulatorName,
													  name + "[gl_InvocationID]",
													  shaderType,
													  storage,
													  program,
													  varType.getElementType());
			}
			else if (shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION)
			{
				// implicit sized tessellation input array, size = output patch max size. Read all to prevent optimizations
				DE_ASSERT(program->getTessellationNumOutputPatchVertices() > 0);
				for (int ndx = 0; ndx < (int)program->getTessellationNumOutputPatchVertices(); ++ndx)
				{
					writeVariableReadAccumulateExpression(buf,
														  accumulatorName,
														  name + "[" + de::toString(ndx) + "]",
														  shaderType,
														  storage,
														  program,
														  varType.getElementType());
				}
			}
			else
				DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(false);
}